

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ES5ArrayTypeHandler.cpp
# Opt level: O1

BOOL __thiscall
Js::ES5ArrayTypeHandlerBase<int>::IsObjectArrayFrozen
          (ES5ArrayTypeHandlerBase<int> *this,ES5Array *arr)

{
  byte bVar1;
  uint32 index;
  bool bVar2;
  bool bVar3;
  BOOL BVar4;
  BOOL BVar5;
  int iVar6;
  int iVar7;
  uint *puVar8;
  IndexPropertyDescriptor *pIVar9;
  BaseDictionary<unsigned_int,_Js::IndexPropertyDescriptor,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_00;
  void *local_40;
  Var value;
  
  value = arr;
  BVar4 = DictionaryTypeHandlerBase<int>::IsFrozen
                    (&this->super_DictionaryTypeHandlerBase<int>,(DynamicObject *)arr);
  BVar5 = 0;
  if (BVar4 != 0) {
    this_00 = (((this->indexPropertyMap).ptr)->indexPropertyMap).ptr;
    iVar6 = this_00->count - this_00->freeCount;
    bVar3 = 0 < iVar6;
    if (0 < iVar6) {
      iVar6 = 0;
      do {
        puVar8 = JsUtil::
                 BaseDictionary<unsigned_int,_Js::IndexPropertyDescriptor,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                 ::GetKeyAt(this_00,iVar6);
        index = *puVar8;
        pIVar9 = JsUtil::
                 BaseDictionary<unsigned_int,_Js::IndexPropertyDescriptor,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                 ::GetReferenceAt((((this->indexPropertyMap).ptr)->indexPropertyMap).ptr,iVar6);
        bVar1 = pIVar9->Attributes;
        bVar2 = false;
        if ((((bVar1 & 8) == 0) && (bVar2 = true, (bVar1 & 2) == 0)) &&
           (((bVar1 & 4) == 0 ||
            (BVar4 = JavascriptArray::DirectGetItemAt<void*>
                               ((JavascriptArray *)value,index,&local_40), BVar4 == 0)))) {
          bVar2 = false;
        }
        if (bVar2) {
          if (bVar3) {
            return 0;
          }
          break;
        }
        iVar6 = iVar6 + 1;
        this_00 = (((this->indexPropertyMap).ptr)->indexPropertyMap).ptr;
        iVar7 = this_00->count - this_00->freeCount;
        bVar3 = iVar6 < iVar7;
      } while (iVar6 < iVar7);
    }
    if (((this->dataItemAttributes & 6) != 0) &&
       (bVar3 = HasAnyDataItemNotInMap(this,(ES5Array *)value), bVar3)) {
      return 0;
    }
    BVar5 = 1;
  }
  return BVar5;
}

Assistant:

BOOL ES5ArrayTypeHandlerBase<T>::IsObjectArrayFrozen(ES5Array* arr)
    {
        if (!__super::IsFrozen(arr))
        {
            return false;
        }

        for (int i = 0; i < indexPropertyMap->Count(); i++)
        {
            uint32 index = indexPropertyMap->GetKeyAt(i);
            IndexPropertyDescriptor* descriptor = indexPropertyMap->GetReferenceAt(i);

            if (descriptor->Attributes & PropertyDeleted)
            {
                continue; // Skip deleted
            }
            if (descriptor->Attributes & PropertyConfigurable)
            {
                return false;
            }

            if ((descriptor->Attributes & PropertyWritable) && HasDataItem(arr, index))
            {
                //Only data descriptor has Writable property
                return false;
            }
        }

        // Check data item not in map
        if (this->GetDataItemAttributes() & (PropertyWritable | PropertyConfigurable))
        {
            if (HasAnyDataItemNotInMap(arr))
            {
                return false;
            }
        }

        return true;
    }